

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

uint * Kit_DsdTruthComputeOne(Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk,uint uSupp)

{
  ushort uVar1;
  undefined2 uVar2;
  Vec_Ptr_t *pVVar3;
  void *pvVar4;
  void *pvVar5;
  uint *puVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  if (uSupp != 0) {
    Kit_DsdGetSupports(pNtk);
  }
  uVar1 = pNtk->nVars;
  if ((int)(uint)uVar1 <= p->nVars) {
    if ((ulong)uVar1 != 0) {
      pVVar3 = p->vTtNodes;
      uVar7 = 0;
      do {
        if (((long)pVVar3->nSize <= (long)uVar7) || ((long)p->vTtElems->nSize <= (long)uVar7)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar8 = 1 << ((char)p->nVars - 5U & 0x1f);
        if (p->nVars < 6) {
          uVar8 = 1;
        }
        if (0 < (int)uVar8) {
          pvVar4 = pVVar3->pArray[uVar7];
          pvVar5 = p->vTtElems->pArray[uVar7];
          uVar9 = (ulong)uVar8 + 1;
          do {
            *(undefined4 *)((long)pvVar4 + uVar9 * 4 + -8) =
                 *(undefined4 *)((long)pvVar5 + uVar9 * 4 + -8);
            uVar9 = uVar9 - 1;
          } while (1 < uVar9);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar1);
    }
    puVar6 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,(uint)(pNtk->Root >> 1),uSupp);
    if ((pNtk->Root & 1) != 0) {
      uVar2 = pNtk->nVars;
      uVar8 = 1 << ((char)uVar2 - 5U & 0x1f);
      if ((ushort)uVar2 < 6) {
        uVar8 = 1;
      }
      if (0 < (int)uVar8) {
        uVar7 = (ulong)uVar8 + 1;
        do {
          puVar6[uVar7 - 2] = ~puVar6[uVar7 - 2];
          uVar7 = uVar7 - 1;
        } while (1 < uVar7);
      }
    }
    return puVar6;
  }
  __assert_fail("pNtk->nVars <= p->nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                ,0x340,
                "unsigned int *Kit_DsdTruthComputeOne(Kit_DsdMan_t *, Kit_DsdNtk_t *, unsigned int)"
               );
}

Assistant:

unsigned * Kit_DsdTruthComputeOne( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk, unsigned uSupp )
{
    unsigned * pTruthRes;
    int i;
    // if support is specified, request that supports are available
    if ( uSupp )
        Kit_DsdGetSupports( pNtk );
    // assign elementary truth tables
    assert( pNtk->nVars <= p->nVars );
    for ( i = 0; i < (int)pNtk->nVars; i++ )
        Kit_TruthCopy( (unsigned *)Vec_PtrEntry(p->vTtNodes, i), (unsigned *)Vec_PtrEntry(p->vTtElems, i), p->nVars );
    // compute truth table for each node
    pTruthRes = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(pNtk->Root), uSupp );
    // complement the truth table if needed
    if ( Abc_LitIsCompl(pNtk->Root) )
        Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
    return pTruthRes;
}